

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void __thiscall SimpleLoggerMgr::~SimpleLoggerMgr(SimpleLoggerMgr *this)

{
  unique_lock<std::mutex> l;
  
  LOCK();
  (this->termination)._M_base._M_i = true;
  UNLOCK();
  signal(0xb,(__sighandler_t)this->oldSigSegvHandler);
  signal(6,(__sighandler_t)this->oldSigAbortHandler);
  std::unique_lock<std::mutex>::unique_lock(&l,&this->cvFlusherLock);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(&l);
  std::unique_lock<std::mutex>::unique_lock(&l,&this->cvCompressorLock);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(&l);
  if ((this->tFlush)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->tCompress)._M_id._M_thread != 0) {
    std::thread::join();
  }
  free(this->stackTraceBuffer);
  std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>::
  ~vector(&this->crashDumpThreadStacks);
  std::ofstream::~ofstream(&this->crashDumpFile);
  std::__cxx11::string::~string((string *)&this->crashDumpPath);
  std::__cxx11::string::~string((string *)&this->globalCriticalInfo);
  std::condition_variable::~condition_variable(&this->cvCompressor);
  std::condition_variable::~condition_variable(&this->cvFlusher);
  std::__cxx11::
  _List_base<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>::_M_clear
            (&(this->pendingCompElems).
              super__List_base<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>
            );
  std::thread::~thread(&this->tCompress);
  std::thread::~thread(&this->tFlush);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->activeThreads)._M_h);
  std::
  _Hashtable<SimpleLogger_*,_SimpleLogger_*,_std::allocator<SimpleLogger_*>,_std::__detail::_Identity,_std::equal_to<SimpleLogger_*>,_std::hash<SimpleLogger_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->loggers)._M_h);
  return;
}

Assistant:

SimpleLoggerMgr::~SimpleLoggerMgr() {
    termination = true;

#if defined(__linux__) || defined(__APPLE__)
    signal(SIGSEGV, oldSigSegvHandler);
    signal(SIGABRT, oldSigAbortHandler);
#endif
    {   std::unique_lock<std::mutex> l(cvFlusherLock);
        cvFlusher.notify_all();
    }
    {   std::unique_lock<std::mutex> l(cvCompressorLock);
        cvCompressor.notify_all();
    }
    if (tFlush.joinable()) {
        tFlush.join();
    }
    if (tCompress.joinable()) {
        tCompress.join();
    }

    free(stackTraceBuffer);
}